

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> * __thiscall
imrt::ApertureILS::getShuffledIntensityNeighbors
          (vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
           *__return_storage_ptr__,ApertureILS *this,Plan *P)

{
  pointer *pppVar1;
  iterator iVar2;
  pointer ppVar3;
  pointer ppVar4;
  double dVar5;
  int iVar6;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *__x;
  ulong uVar7;
  pointer ppVar8;
  long lVar9;
  Station *this_00;
  uint aperture;
  long lVar10;
  ulong uVar11;
  _List_node_base *p_Var12;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> stations;
  pair<int,_int> local_50;
  double local_48;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> local_40;
  
  __x = Plan::get_stations_abi_cxx11_(P);
  p_Var12 = (_List_node_base *)&local_40;
  std::__cxx11::list<imrt::Station_*,_std::allocator<imrt::Station_*>_>::list
            ((list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)p_Var12,__x);
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_40.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
      _M_size != 0) {
    uVar11 = 0;
    uVar7 = local_40.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
            _M_node._M_size;
    do {
      p_Var12 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)&p_Var12->_M_next
                 )->_M_impl)._M_node.super__List_node_base._M_next;
      this_00 = (Station *)p_Var12[1]._M_next;
      if (0 < this_00->max_apertures) {
        lVar10 = 0;
        do {
          aperture = (uint)lVar10;
          dVar5 = Station::getApertureIntensity(this_00,aperture);
          if (0.0 < dVar5) {
            local_50 = (pair<int,_int>)((ulong)~aperture << 0x20 | uVar11);
            iVar2._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         __return_storage_ptr__,iVar2,&local_50);
            }
            else {
              *iVar2._M_current = local_50;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          local_48 = Station::getApertureIntensity((Station *)p_Var12[1]._M_next,aperture);
          iVar6 = Station::getMaxIntensity((Station *)p_Var12[1]._M_next);
          if (local_48 <= (double)iVar6) {
            local_50 = (pair<int,_int>)(lVar10 + 1 << 0x20 | uVar11);
            iVar2._M_current =
                 (__return_storage_ptr__->
                 super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish;
            if (iVar2._M_current ==
                (__return_storage_ptr__->
                super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>).
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::
              _M_realloc_insert<std::pair<int,int>>
                        ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                         __return_storage_ptr__,iVar2,&local_50);
            }
            else {
              *iVar2._M_current = local_50;
              pppVar1 = &(__return_storage_ptr__->
                         super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                         )._M_impl.super__Vector_impl_data._M_finish;
              *pppVar1 = *pppVar1 + 1;
            }
          }
          lVar10 = lVar10 + 1;
          this_00 = (Station *)p_Var12[1]._M_next;
          uVar7 = local_40.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                  _M_impl._M_node._M_size;
        } while (lVar10 < this_00->max_apertures);
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar7);
    ppVar3 = (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_start;
    ppVar4 = (__return_storage_ptr__->
             super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>)._M_impl
             .super__Vector_impl_data._M_finish;
    if ((ppVar3 != ppVar4) && (ppVar3 + 1 != ppVar4)) {
      lVar10 = 8;
      do {
        iVar6 = rand();
        lVar9 = (long)iVar6 % ((lVar10 >> 3) + 1);
        if (lVar10 != lVar9 * 8) {
          ppVar8 = ppVar3 + lVar9;
          iVar6 = *(int *)((long)&ppVar3->first + lVar10);
          *(int *)((long)&ppVar3->first + lVar10) = ppVar8->first;
          ppVar8->first = iVar6;
          iVar6 = *(int *)((long)&ppVar3->second + lVar10);
          *(int *)((long)&ppVar3->second + lVar10) = ppVar8->second;
          ppVar8->second = iVar6;
        }
        ppVar8 = (pointer)((long)&ppVar3[1].first + lVar10);
        lVar10 = lVar10 + 8;
      } while (ppVar8 != ppVar4);
    }
  }
  while (local_40.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
         _M_node.super__List_node_base._M_next != (_List_node_base *)&local_40) {
    p_Var12 = (((_List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_> *)
               &(local_40.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                 _M_impl._M_node.super__List_node_base._M_next)->_M_next)->_M_impl)._M_node.
              super__List_node_base._M_next;
    operator_delete(local_40.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                    _M_impl._M_node.super__List_node_base._M_next);
    local_40.super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl._M_node.
    super__List_node_base._M_next = p_Var12;
  }
  return __return_storage_ptr__;
}

Assistant:

vector < pair<int, int> > ApertureILS::getShuffledIntensityNeighbors(Plan &P){
  list<Station*> stations = P.get_stations();
  vector<pair<int, int>> a_list;
  list<Station*>::iterator s;
  s = stations.begin();
  for (int i = 0; i < stations.size(); i++) {
    for (int j = 0; j < (*s)->getNbApertures();j++){
      //One pair -j (-aperture) for reducing intensity
      //One pair for increasing intensity (+j)
      if ((*s)->getApertureIntensity(j) > 0)
        a_list.push_back(make_pair(i,-(j+1)));
      
      if ((*s)->getApertureIntensity(j) <= (*s)->getMaxIntensity())
        a_list.push_back(make_pair(i,(j+1)));
    }
    std::advance(s,1);
  }
  //cout << "Size neighborhood " << a_list.size()<< endl;
  std::random_shuffle(a_list.begin(), a_list.end());
  return(a_list);
}